

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brandes.cpp
# Opt level: O0

void write_results(string *file_name)

{
  double dVar1;
  bool bVar2;
  reference piVar3;
  reference __x;
  reference __y;
  reference ppVar4;
  ostream *this;
  undefined8 in_RDI;
  pair<int,_double> v_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *__range1_1;
  int v;
  iterator __end1;
  iterator __begin1;
  set<int,_std::less<int>,_std::allocator<int>_> *__range1;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> result_vertices;
  ofstream output_file;
  value_type *in_stack_fffffffffffffd28;
  ostream *in_stack_fffffffffffffd30;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  in_stack_fffffffffffffd38;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  in_stack_fffffffffffffd40;
  int local_298;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  local_280;
  undefined1 *local_278;
  pair<int,_double> *local_270;
  pair<int,_double> *local_268;
  pair<int,_double> local_260;
  int local_24c;
  _Self local_248;
  _Self local_240;
  set<int,_std::less<int>,_std::allocator<int>_> *local_238;
  undefined1 local_230 [40];
  ostream local_208 [520];
  
  std::ofstream::ofstream(local_208);
  std::ofstream::open(local_208,in_RDI,0x10);
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
            ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x102c29);
  local_238 = &non_dead_end_vertices;
  local_240._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffd28);
  local_248._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::end
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffd28);
  while( true ) {
    bVar2 = std::operator!=(&local_240,&local_248);
    if (!bVar2) break;
    piVar3 = std::_Rb_tree_const_iterator<int>::operator*((_Rb_tree_const_iterator<int> *)0x102c8b);
    local_24c = *piVar3;
    __x = std::vector<int,_std::allocator<int>_>::operator[](&read_remapped,(long)local_24c);
    __y = std::vector<double,_std::allocator<double>_>::operator[]
                    (&betweenness_centrality,(long)local_24c);
    std::pair<int,_double>::pair<int_&,_double_&,_true>(&local_260,__x,__y);
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::push_back
              ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
               in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    std::_Rb_tree_const_iterator<int>::operator++
              ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffffd30);
  }
  local_268 = (pair<int,_double> *)
              std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::begin
                        ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *
                         )in_stack_fffffffffffffd28);
  local_270 = (pair<int,_double> *)
              std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::end
                        ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *
                         )in_stack_fffffffffffffd28);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>>
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  local_278 = local_230;
  local_280._M_current =
       (pair<int,_double> *)
       std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::begin
                 ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                  in_stack_fffffffffffffd28);
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::end
            ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
             in_stack_fffffffffffffd28);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                        *)in_stack_fffffffffffffd30,
                       (__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                        *)in_stack_fffffffffffffd28);
    if (!bVar2) break;
    ppVar4 = __gnu_cxx::
             __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
             ::operator*(&local_280);
    dVar1 = ppVar4->second;
    local_298 = (int)*(undefined8 *)ppVar4;
    in_stack_fffffffffffffd40._M_current =
         (pair<int,_double> *)std::ostream::operator<<(local_208,local_298);
    this = std::operator<<((ostream *)in_stack_fffffffffffffd40._M_current," ");
    in_stack_fffffffffffffd30 = (ostream *)std::ostream::operator<<(this,dVar1);
    std::ostream::operator<<(in_stack_fffffffffffffd30,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
    ::operator++(&local_280);
  }
  std::ofstream::close();
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~vector
            ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
             in_stack_fffffffffffffd40._M_current);
  std::ofstream::~ofstream(local_208);
  return;
}

Assistant:

void write_results(std::string file_name) {
    std::ofstream output_file;
    output_file.open(file_name);

    std::vector<std::pair<int, double>> result_vertices;

    for (auto v : non_dead_end_vertices) {
        result_vertices.push_back(std::pair<int, double>(read_remapped[v], betweenness_centrality[v]));
    }

    sort(result_vertices.begin(), result_vertices.end());

    for (auto v : result_vertices) {
        output_file << v.first << " " << v.second << std::endl;
    }

    output_file.close();
}